

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Matches * __thiscall
Catch::TestSpec::matchesByFilter
          (TestSpec *this,vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *testCases,
          IConfig *config)

{
  anon_class_16_2_7787a108 __unary_op;
  size_type __n;
  const_iterator __first;
  iterator __last;
  FilterMatch *in_RCX;
  IConfig *in_RDX;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *in_RSI;
  allocator_type *in_RDI;
  Matches *matches;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
  *in_stack_ffffffffffffff68;
  allocator_type *__a;
  vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *this_00;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff98;
  vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> local_22;
  
  local_22.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._M_start._1_1_ = 0;
  __a = in_RDI;
  local_22.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._2_8_ = in_RCX;
  local_22.
  super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>.
  _M_impl.super__Vector_impl_data._10_8_ = in_RDX;
  __n = clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::size
                  (in_RSI);
  this_00 = &local_22;
  clara::std::allocator<Catch::TestSpec::FilterMatch>::allocator
            ((allocator<Catch::TestSpec::FilterMatch> *)0x28d52c);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  vector(this_00,__n,__a);
  clara::std::allocator<Catch::TestSpec::FilterMatch>::~allocator
            ((allocator<Catch::TestSpec::FilterMatch> *)0x28d54c);
  clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::begin
            (in_stack_ffffffffffffff68);
  __first = clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::
            end(in_stack_ffffffffffffff68);
  __last = clara::std::
           vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
           begin((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                  *)in_stack_ffffffffffffff68);
  __unary_op.config =
       (IConfig *)
       local_22.
       super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
       ._M_impl.super__Vector_impl_data._10_8_;
  __unary_op.testCases = in_stack_ffffffffffffff98;
  std::
  transform<__gnu_cxx::__normal_iterator<Catch::TestSpec::Filter_const*,std::vector<Catch::TestSpec::Filter,std::allocator<Catch::TestSpec::Filter>>>,__gnu_cxx::__normal_iterator<Catch::TestSpec::FilterMatch*,std::vector<Catch::TestSpec::FilterMatch,std::allocator<Catch::TestSpec::FilterMatch>>>,Catch::TestSpec::matchesByFilter(std::vector<Catch::TestCase,std::allocator<Catch::TestCase>>const&,Catch::IConfig_const&)const::__0>
            ((__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
              )__first._M_current,
             (__normal_iterator<const_Catch::TestSpec::Filter_*,_std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>_>
              )__last._M_current,
             (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
              )local_22.
               super__Vector_base<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
               ._M_impl.super__Vector_impl_data._2_8_,__unary_op);
  return (Matches *)in_RDI;
}

Assistant:

TestSpec::Matches TestSpec::matchesByFilter( std::vector<TestCase> const& testCases, IConfig const& config ) const
    {
        Matches matches( m_filters.size() );
        std::transform( m_filters.begin(), m_filters.end(), matches.begin(), [&]( Filter const& filter ){
            std::vector<TestCase const*> currentMatches;
            for( auto const& test : testCases )
                if( isThrowSafe( test, config ) && filter.matches( test ) )
                    currentMatches.emplace_back( &test );
            return FilterMatch{ filter.name(), currentMatches };
        } );
        return matches;
    }